

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void compile_assert_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  sljit_compiler *compiler_00;
  jump_list *pjVar1;
  sljit_label *psVar2;
  sljit_jump *psVar3;
  sljit_jump *local_38;
  sljit_jump *brajump;
  PCRE2_SPTR16 pPStack_28;
  PCRE2_UCHAR16 bra;
  PCRE2_SPTR16 cc;
  sljit_compiler *compiler;
  backtrack_common *current_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  pPStack_28 = current->cc;
  brajump._6_2_ = 0x83;
  local_38 = (sljit_jump *)0x0;
  if (*pPStack_28 == 0x93) {
    brajump._6_2_ = *pPStack_28;
    pPStack_28 = pPStack_28 + 1;
  }
  if (brajump._6_2_ == 0x93) {
    sljit_emit_op1(compiler_00,0x20,2,0,0x8c,0);
  }
  if (*(int *)&current[1].nextbacktracks < 0) {
    pjVar1 = current->topbacktracks;
    psVar2 = sljit_emit_label(compiler_00);
    set_jumps(pjVar1,psVar2);
    if (brajump._6_2_ == 0x93) {
      sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
      psVar3 = sljit_emit_cmp(compiler_00,1,2,0,0x40,0);
      sljit_set_label(psVar3,(sljit_label *)current[1].top);
      free_stack(common,1);
    }
  }
  else {
    if (brajump._6_2_ == 0x93) {
      if ((*pPStack_28 == 0x7f) || (*pPStack_28 == 0x81)) {
        sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
        psVar3 = sljit_emit_cmp(compiler_00,1,2,0,0x40,0);
        sljit_set_label(psVar3,(sljit_label *)current[1].top);
        free_stack(common,1);
        return;
      }
      free_stack(common,1);
      local_38 = sljit_emit_cmp(compiler_00,0,2,0,0x40,0);
    }
    if ((*pPStack_28 == 0x7e) || (*pPStack_28 == 0x80)) {
      sljit_emit_op1(compiler_00,0x20,0xc,0,0x8e,
                     (long)*(int *)((long)&current[1].nextbacktracks + 4));
      psVar3 = sljit_emit_jump(compiler_00,0x19);
      add_jump(compiler_00,&common->revertframes,psVar3);
      sljit_emit_op1(compiler_00,0x20,1,0,0x8c,-0x10);
      sljit_emit_op2(compiler_00,0x60,0xc,0,0xc,0,0x40,
                     (long)(*(int *)&current[1].nextbacktracks + -1) << 3);
      sljit_emit_op1(compiler_00,0x20,0x8e,(long)*(int *)((long)&current[1].nextbacktracks + 4),1,0)
      ;
      pjVar1 = current->topbacktracks;
      psVar2 = sljit_emit_label(compiler_00);
      set_jumps(pjVar1,psVar2);
    }
    else {
      pjVar1 = current->topbacktracks;
      psVar2 = sljit_emit_label(compiler_00);
      set_jumps(pjVar1,psVar2);
    }
    if (brajump._6_2_ == 0x93) {
      sljit_emit_op2(compiler_00,0x62,0xc,0,0xc,0,0x40,8);
      sljit_emit_op1(compiler_00,0x20,0x8c,0,0x40,0);
      psVar3 = sljit_emit_jump(compiler_00,0x18);
      sljit_set_label(psVar3,(sljit_label *)current[1].top);
      psVar2 = sljit_emit_label(compiler_00);
      sljit_set_label(local_38,psVar2);
    }
  }
  return;
}

Assistant:

static void compile_assert_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
PCRE2_SPTR cc = current->cc;
PCRE2_UCHAR bra = OP_BRA;
struct sljit_jump *brajump = NULL;

SLJIT_ASSERT(*cc != OP_BRAMINZERO);
if (*cc == OP_BRAZERO)
  {
  bra = *cc;
  cc++;
  }

if (bra == OP_BRAZERO)
  {
  SLJIT_ASSERT(current->topbacktracks == NULL);
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
  }

if (CURRENT_AS(assert_backtrack)->framesize < 0)
  {
  set_jumps(current->topbacktracks, LABEL());

  if (bra == OP_BRAZERO)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    }
  return;
  }

if (bra == OP_BRAZERO)
  {
  if (*cc == OP_ASSERT_NOT || *cc == OP_ASSERTBACK_NOT)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    return;
    }
  free_stack(common, 1);
  brajump = CMP(SLJIT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0);
  }

if (*cc == OP_ASSERT || *cc == OP_ASSERTBACK)
  {
  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr);
  add_jump(compiler, &common->revertframes, JUMP(SLJIT_FAST_CALL));
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(-2));
  OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, (CURRENT_AS(assert_backtrack)->framesize - 1) * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr, TMP1, 0);

  set_jumps(current->topbacktracks, LABEL());
  }
else
  set_jumps(current->topbacktracks, LABEL());

if (bra == OP_BRAZERO)
  {
  /* We know there is enough place on the stack. */
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
  JUMPTO(SLJIT_JUMP, CURRENT_AS(assert_backtrack)->matchingpath);
  JUMPHERE(brajump);
  }
}